

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# emit_dfa.cc
# Opt level: O1

void __thiscall
re2c::DFA::emit_body
          (DFA *this,OutputFile *o,uint32_t *ind,
          set<re2c::label_t,_std::less<re2c::label_t>,_std::allocator<re2c::label_t>_> *used_labels,
          label_t initial)

{
  uint32_t ind_00;
  const_iterator cVar1;
  OutputFile *pOVar2;
  opt_t *poVar3;
  State *s;
  bool readCh;
  DFA *local_80;
  OutputFile *local_78;
  _Base_ptr local_70;
  _Rb_tree<re2c::label_t,_re2c::label_t,_std::_Identity<re2c::label_t>,_std::less<re2c::label_t>,_std::allocator<re2c::label_t>_>
  *local_68;
  string *local_60;
  ulong local_58;
  string local_50;
  
  local_80 = this;
  cVar1 = std::
          _Rb_tree<re2c::label_t,_re2c::label_t,_std::_Identity<re2c::label_t>,_std::less<re2c::label_t>,_std::allocator<re2c::label_t>_>
          ::find(&used_labels->_M_t,&this->head->label);
  local_70 = &(used_labels->_M_t)._M_impl.super__Rb_tree_header._M_header;
  if (cVar1._M_node != local_70) {
    pOVar2 = OutputFile::wind(o,*ind);
    pOVar2 = OutputFile::ws(pOVar2,"goto ");
    poVar3 = realopt_t::operator->((realopt_t *)&DAT_0015d868);
    pOVar2 = OutputFile::wstring(pOVar2,&poVar3->labelPrefix);
    pOVar2 = OutputFile::wlabel(pOVar2,initial);
    OutputFile::ws(pOVar2,";\n");
  }
  s = local_80->head;
  if (s != (State *)0x0) {
    local_58 = (long)(local_80->accepts).elems.
                     super__Vector_base<const_re2c::State_*,_std::allocator<const_re2c::State_*>_>.
                     _M_impl.super__Vector_impl_data._M_finish -
               (long)(local_80->accepts).elems.
                     super__Vector_base<const_re2c::State_*,_std::allocator<const_re2c::State_*>_>.
                     _M_impl.super__Vector_impl_data._M_start;
    local_60 = &local_80->cond;
    local_78 = o;
    local_68 = &used_labels->_M_t;
    do {
      readCh = false;
      ind_00 = *ind;
      cVar1 = std::
              _Rb_tree<re2c::label_t,_re2c::label_t,_std::_Identity<re2c::label_t>,_std::less<re2c::label_t>,_std::allocator<re2c::label_t>_>
              ::find(&used_labels->_M_t,&s->label);
      poVar3 = realopt_t::operator->((realopt_t *)&DAT_0015d868);
      if (poVar3->target != DOT) {
        if (cVar1._M_node != local_70) {
          poVar3 = realopt_t::operator->((realopt_t *)&DAT_0015d868);
          pOVar2 = OutputFile::wstring(local_78,&poVar3->labelPrefix);
          pOVar2 = OutputFile::wlabel(pOVar2,(label_t)(s->label).value);
          OutputFile::ws(pOVar2,":\n");
        }
        poVar3 = realopt_t::operator->((realopt_t *)&DAT_0015d868);
        if ((poVar3->dFlag == true) && ((s->action).type != INITIAL)) {
          pOVar2 = OutputFile::wind(local_78,ind_00);
          poVar3 = realopt_t::operator->((realopt_t *)&DAT_0015d868);
          pOVar2 = OutputFile::wstring(pOVar2,&poVar3->yydebug);
          pOVar2 = OutputFile::ws(pOVar2,"(");
          pOVar2 = OutputFile::wlabel(pOVar2,(label_t)(s->label).value);
          pOVar2 = OutputFile::ws(pOVar2,", ");
          poVar3 = realopt_t::operator->((realopt_t *)&DAT_0015d868);
          InputAPI::expr_peek_abi_cxx11_(&local_50,&poVar3->input_api);
          pOVar2 = OutputFile::wstring(pOVar2,&local_50);
          OutputFile::ws(pOVar2,");\n");
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_50._M_dataplus._M_p != &local_50.field_2) {
            operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
          }
        }
      }
      used_labels = (set<re2c::label_t,_std::less<re2c::label_t>,_std::allocator<re2c::label_t>_> *)
                    local_68;
      pOVar2 = local_78;
      emit_action(&s->action,local_78,*ind,&readCh,s,local_60,local_80->skeleton,
                  (set<re2c::label_t,_std::less<re2c::label_t>,_std::allocator<re2c::label_t>_> *)
                  local_68,8 < local_58);
      Go::emit(&s->go,pOVar2,*ind,&readCh);
      s = s->next;
    } while (s != (State *)0x0);
  }
  return;
}

Assistant:

void DFA::emit_body (OutputFile & o, uint32_t& ind, const std::set<label_t> & used_labels, label_t initial) const
{
	// If DFA has transitions to initial state, then initial state
	// has a piece of code that advances input position. Wee must
	// skip it when entering DFA.
	if (used_labels.count(head->label))
	{
		o.wind(ind).ws("goto ").wstring(opts->labelPrefix).wlabel(initial).ws(";\n");
	}

	const bool save_yyaccept = accepts.size () > 1;
	for (State * s = head; s; s = s->next)
	{
		bool readCh = false;
		emit_state (o, ind, s, used_labels.count (s->label) != 0);
		emit_action (s->action, o, ind, readCh, s, cond, skeleton, used_labels, save_yyaccept);
		s->go.emit(o, ind, readCh);
	}
}